

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

aom_codec_err_t
av1_get_seq_level_idx(SequenceHeader *seq_params,AV1LevelParams *level_params,int *seq_level_idx)

{
  int iVar1;
  TARGET_LEVEL_FAIL_ID TVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  TARGET_LEVEL_FAIL_ID fail_id;
  int level;
  AV1LevelInfo *level_info;
  int tier;
  int op;
  BITSTREAM_PROFILE profile;
  int is_still_picture;
  AV1LevelInfo *in_stack_00000038;
  int local_34;
  int local_24;
  
  local_24 = 0;
  do {
    if (*(int *)(in_RDI + 0x70) + 1 <= local_24) {
      return AOM_CODEC_OK;
    }
    *(undefined4 *)(in_RDX + (long)local_24 * 4) = 0x1f;
    if ((*(uint *)(in_RSI + 0x20) >> ((byte)local_24 & 0x1f) & 1) != 0) {
      local_34 = 0;
      while( true ) {
        if (0x1b < local_34) break;
        iVar1 = is_valid_seq_level_idx((AV1_LEVEL)local_34);
        if (iVar1 != 0) {
          TVar2 = check_level_constraints
                            (in_stack_00000038,seq_params._7_1_,(int)seq_params,level_params._4_4_,
                             level_params._3_1_,seq_level_idx._4_4_);
          if (TVar2 == TARGET_LEVEL_OK) {
            *(int *)(in_RDX + (long)local_24 * 4) = local_34;
            break;
          }
        }
        local_34 = local_34 + 1;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

aom_codec_err_t av1_get_seq_level_idx(const SequenceHeader *seq_params,
                                      const AV1LevelParams *level_params,
                                      int *seq_level_idx) {
  const int is_still_picture = seq_params->still_picture;
  const BITSTREAM_PROFILE profile = seq_params->profile;
  for (int op = 0; op < seq_params->operating_points_cnt_minus_1 + 1; ++op) {
    seq_level_idx[op] = (int)SEQ_LEVEL_MAX;
    if (!((level_params->keep_level_stats >> op) & 1)) continue;
    const int tier = seq_params->tier[op];
    const AV1LevelInfo *const level_info = level_params->level_info[op];
    assert(level_info != NULL);
    for (int level = 0; level < SEQ_LEVELS; ++level) {
      if (!is_valid_seq_level_idx(level)) continue;
      const TARGET_LEVEL_FAIL_ID fail_id = check_level_constraints(
          level_info, level, tier, is_still_picture, profile, 1);
      if (fail_id == TARGET_LEVEL_OK) {
        seq_level_idx[op] = level;
        break;
      }
    }
  }

  return AOM_CODEC_OK;
}